

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

void __thiscall pbrt::CameraBase::FindMinimumDifferentials(CameraBase *this,CameraHandle *camera)

{
  anon_struct_8_0_00000001_for___align aVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  CameraSample sample;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 time;
  int i;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_ZMM20 [64];
  Vector3f VVar49;
  Vector3f v;
  string ret;
  SampledWavelengths lambda;
  undefined1 local_100 [112];
  bool local_90;
  Vector3f *local_88;
  Vector3f *local_80;
  Vector3f *local_78;
  Vector3f *local_70;
  float local_68;
  float fStack_64;
  undefined8 uStack_60;
  undefined8 local_58;
  SampledWavelengths local_50;
  undefined1 auVar32 [56];
  float fVar33;
  
  auVar28._8_4_ = 0x7f800000;
  auVar28._0_8_ = 0x7f8000007f800000;
  auVar28._12_4_ = 0x7f800000;
  local_80 = &this->minDirDifferentialY;
  local_88 = &this->minDirDifferentialX;
  local_70 = &this->minPosDifferentialY;
  local_78 = &this->minPosDifferentialX;
  uVar6 = vmovlps_avx(auVar28);
  (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar6;
  (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar6 >> 0x20);
  (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  uVar11 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar12 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar11;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar12;
  (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar11;
  (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar12;
  (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar11;
  (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar12;
  SampledWavelengths::SampleXYZ(&local_50,0.5);
  iVar16 = 0;
  do {
    auVar17 = in_ZMM20._0_16_;
    auVar28 = vcvtsi2ss_avx512f(auVar17,iVar16);
    fStack_64 = auVar28._0_4_ / 511.0;
    uVar6 = *(undefined8 *)
             ((this->film).super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
             0xffffffffffff);
    auVar28 = vcvtsi2ss_avx512f(auVar17,(int)uVar6);
    auVar17 = vcvtsi2ss_avx512f(auVar17,(int)((ulong)uVar6 >> 0x20));
    local_68 = fStack_64 * auVar28._0_4_;
    fStack_64 = fStack_64 * auVar17._0_4_;
    uStack_60 = 0x3f0000003f000000;
    local_58 = 0x3f8000003f000000;
    sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fStack_64;
    sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x = local_68;
    sample.pLens.super_Tuple2<pbrt::Point2,_float>.x = 0.5;
    sample.pLens.super_Tuple2<pbrt::Point2,_float>.y = 0.5;
    sample.time = 0.5;
    sample.weight = 1.0;
    CameraHandle::GenerateRayDifferential
              ((optional<pbrt::CameraRayDifferential> *)local_100,camera,sample,&local_50);
    time = local_100._24_4_;
    uVar15 = local_100._8_4_;
    if (local_90 == true) {
      uVar13 = local_100._0_4_;
      uVar14 = local_100._4_4_;
      auVar28 = vinsertps_avx(ZEXT416((uint)((float)local_100._44_4_ - (float)local_100._0_4_)),
                              ZEXT416((uint)((float)local_100._48_4_ - (float)local_100._4_4_)),0x10
                             );
      VVar49.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar28._0_8_;
      VVar49.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_100._52_4_ - (float)local_100._8_4_
      ;
      auVar32 = ZEXT856(auVar28._8_8_);
      VVar49 = AnimatedTransform::ApplyInverse
                         ((AnimatedTransform *)this,VVar49,(Float)local_100._24_4_);
      fVar33 = VVar49.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar30._0_8_ = VVar49.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar30._8_56_ = auVar32;
      uVar2 = (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y;
      uVar7 = (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z;
      fVar27 = (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x;
      auVar35._0_4_ =
           VVar49.super_Tuple3<pbrt::Vector3,_float>.x * VVar49.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar35._4_4_ =
           VVar49.super_Tuple3<pbrt::Vector3,_float>.y * VVar49.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar35._8_4_ = auVar32._0_4_ * auVar32._0_4_;
      auVar35._12_4_ = auVar32._4_4_ * auVar32._4_4_;
      auVar38._0_4_ = (float)uVar2 * (float)uVar2;
      auVar38._4_4_ = (float)uVar7 * (float)uVar7;
      auVar38._8_8_ = 0;
      auVar17 = vpermt2ps_avx512vl(auVar38,_DAT_003eee70,auVar35);
      auVar28 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar27 * fVar27)),0x10);
      auVar26._0_4_ = auVar28._0_4_ + auVar17._0_4_ + fVar33 * fVar33;
      auVar26._4_4_ = auVar28._4_4_ + auVar17._4_4_ + auVar38._4_4_;
      auVar26._8_4_ = auVar28._8_4_ + auVar17._8_4_ + 0.0;
      auVar26._12_4_ = auVar28._12_4_ + auVar17._12_4_ + 0.0;
      auVar17 = vsqrtps_avx(auVar26);
      auVar28 = vmovshdup_avx(auVar17);
      if (auVar17._0_4_ < auVar28._0_4_) {
        uVar6 = vmovlps_avx(auVar30._0_16_);
        (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar6;
        (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar6 >> 0x20);
        (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = fVar33;
      }
      auVar28 = vinsertps_avx(ZEXT416((uint)((float)local_100._56_4_ - (float)uVar13)),
                              ZEXT416((uint)((float)local_100._60_4_ - (float)uVar14)),0x10);
      v.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar28._0_8_;
      v.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_100._64_4_ - (float)uVar15;
      auVar32 = ZEXT856(auVar28._8_8_);
      VVar49 = AnimatedTransform::ApplyInverse((AnimatedTransform *)this,v,(Float)time);
      fVar33 = VVar49.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar31._0_8_ = VVar49.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar31._8_56_ = auVar32;
      uVar3 = (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
      uVar8 = (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z;
      fVar27 = (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x;
      auVar36._0_4_ =
           VVar49.super_Tuple3<pbrt::Vector3,_float>.x * VVar49.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar36._4_4_ =
           VVar49.super_Tuple3<pbrt::Vector3,_float>.y * VVar49.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar36._8_4_ = auVar32._0_4_ * auVar32._0_4_;
      auVar36._12_4_ = auVar32._4_4_ * auVar32._4_4_;
      auVar41._0_4_ = (float)uVar3 * (float)uVar3;
      auVar41._4_4_ = (float)uVar8 * (float)uVar8;
      auVar41._8_8_ = 0;
      auVar17 = vpermt2ps_avx512vl(auVar41,_DAT_003eee70,auVar36);
      auVar28 = vinsertps_avx(auVar36,ZEXT416((uint)(fVar27 * fVar27)),0x10);
      auVar24._0_4_ = auVar28._0_4_ + auVar17._0_4_ + fVar33 * fVar33;
      auVar24._4_4_ = auVar28._4_4_ + auVar17._4_4_ + auVar41._4_4_;
      auVar24._8_4_ = auVar28._8_4_ + auVar17._8_4_ + 0.0;
      auVar24._12_4_ = auVar28._12_4_ + auVar17._12_4_ + 0.0;
      auVar17 = vsqrtps_avx(auVar24);
      auVar28 = vmovshdup_avx(auVar17);
      if (auVar17._0_4_ < auVar28._0_4_) {
        uVar6 = vmovlps_avx(auVar31._0_16_);
        (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar6;
        (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar6 >> 0x20);
        (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = fVar33;
      }
      auVar18._4_4_ = local_100._16_4_;
      auVar18._0_4_ = local_100._12_4_;
      auVar18._8_8_ = 0;
      auVar44._8_4_ = 0x3f800000;
      auVar44._0_8_ = 0x3f8000003f800000;
      auVar44._12_4_ = 0x3f800000;
      auVar47._8_4_ = 0x80000000;
      auVar47._0_8_ = 0x8000000080000000;
      auVar47._12_4_ = 0x80000000;
      in_ZMM20 = ZEXT464(4);
      auVar34._0_4_ = (float)local_100._12_4_ * (float)local_100._12_4_;
      auVar34._4_4_ = (float)local_100._16_4_ * (float)local_100._16_4_;
      auVar34._8_8_ = 0;
      auVar35 = vhaddps_avx(auVar34,auVar34);
      auVar35 = ZEXT416((uint)(auVar35._0_4_ + (float)local_100._20_4_ * (float)local_100._20_4_));
      auVar35 = vsqrtss_avx(auVar35,auVar35);
      fVar27 = auVar35._0_4_;
      auVar20._4_4_ = fVar27;
      auVar20._0_4_ = fVar27;
      auVar20._8_4_ = fVar27;
      auVar20._12_4_ = fVar27;
      auVar35 = vdivps_avx(auVar18,auVar20);
      local_100._20_4_ = (float)local_100._20_4_ / fVar27;
      auVar29 = ZEXT416((uint)local_100._20_4_);
      uVar6 = vmovlps_avx(auVar35);
      local_100._12_4_ = (undefined4)uVar6;
      local_100._16_4_ = (undefined4)((ulong)uVar6 >> 0x20);
      auVar18 = vpternlogd_avx512vl(auVar44,auVar29,auVar47,0xf8);
      auVar36 = vmovshdup_avx(auVar35);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_100._68_8_;
      auVar23._0_4_ = (float)local_100._68_8_ * (float)local_100._68_8_;
      auVar23._4_4_ = SUB84(local_100._68_8_,4) * SUB84(local_100._68_8_,4);
      auVar23._8_8_ = 0;
      auVar26 = vhaddps_avx(auVar23,auVar23);
      auVar26 = ZEXT416((uint)(auVar26._0_4_ + (float)local_100._76_4_ * (float)local_100._76_4_));
      auVar26 = vsqrtss_avx(auVar26,auVar26);
      fVar27 = auVar26._0_4_;
      auVar40._4_4_ = fVar27;
      auVar40._0_4_ = fVar27;
      auVar40._8_4_ = fVar27;
      auVar40._12_4_ = fVar27;
      local_100._76_4_ = (float)local_100._76_4_ / fVar27;
      auVar25 = ZEXT416((uint)local_100._76_4_);
      auVar26 = vdivps_avx(auVar19,auVar40);
      local_100._68_8_ = vmovlps_avx(auVar26);
      auVar24 = vmovshdup_avx(auVar26);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_100._80_8_;
      auVar42._0_4_ = (float)local_100._80_8_ * (float)local_100._80_8_;
      auVar42._4_4_ = SUB84(local_100._80_8_,4) * SUB84(local_100._80_8_,4);
      auVar42._8_8_ = 0;
      auVar38 = vhaddps_avx(auVar42,auVar42);
      auVar38 = ZEXT416((uint)(auVar38._0_4_ + (float)local_100._88_4_ * (float)local_100._88_4_));
      auVar38 = vsqrtss_avx(auVar38,auVar38);
      fVar27 = auVar38._0_4_;
      auVar21._4_4_ = fVar27;
      auVar21._0_4_ = fVar27;
      auVar21._8_4_ = fVar27;
      auVar21._12_4_ = fVar27;
      auVar37._0_4_ = (float)local_100._88_4_ / fVar27;
      auVar37._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar38 = vdivps_avx(auVar22,auVar21);
      fVar39 = auVar18._0_4_;
      fVar45 = -1.0 / (fVar39 + (float)local_100._20_4_);
      fVar33 = auVar35._0_4_;
      fVar46 = auVar36._0_4_;
      local_100._80_8_ = vmovlps_avx(auVar38);
      uVar4 = (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y;
      uVar9 = (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z;
      auVar48._4_4_ = uVar9;
      auVar48._0_4_ = uVar4;
      fVar27 = fVar46 * fVar33 * fVar45;
      auVar41 = vfmadd213ss_fma(ZEXT416((uint)(fVar33 * fVar39 * fVar33)),ZEXT416((uint)fVar45),
                                auVar44);
      fVar33 = fVar33 * -fVar39;
      fVar39 = fVar39 * fVar27;
      auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)(fVar46 * fVar46)),ZEXT416((uint)fVar45));
      auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * fVar46)),auVar35,auVar35);
      auVar48._8_8_ = 0;
      auVar19 = vmulps_avx512vl(auVar48,auVar48);
      auVar20 = vmulss_avx512f(auVar24,ZEXT416((uint)fVar39));
      auVar21 = vmulss_avx512f(auVar18,auVar24);
      auVar34 = vfmadd231ss_fma(auVar34,auVar29,auVar29);
      auVar22 = vfmadd231ss_avx512f(auVar20,auVar26,auVar41);
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * fVar39)),auVar35,auVar41);
      auVar40 = ZEXT416((uint)fVar27);
      auVar21 = vfmadd231ss_avx512f(auVar21,auVar26,auVar40);
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * auVar24._0_4_)),auVar35,auVar26);
      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * auVar18._0_4_)),auVar35,auVar40);
      auVar22 = vfmadd231ss_avx512f(auVar22,auVar25,ZEXT416((uint)fVar33));
      auVar20 = vfmadd231ss_fma(auVar20,auVar29,ZEXT416((uint)fVar33));
      auVar23 = vfnmadd231ss_avx512f(auVar21,auVar25,auVar36);
      auVar26 = vfmadd231ss_fma(auVar26,auVar29,auVar25);
      auVar21 = vfnmadd231ss_fma(auVar24,auVar29,auVar36);
      auVar24 = vmulss_avx512f(auVar22,auVar22);
      auVar25 = vmulss_avx512f(auVar23,auVar23);
      fVar27 = auVar26._0_4_;
      auVar26 = ZEXT416((uint)(fVar27 * fVar27 + auVar24._0_4_ + auVar25._0_4_));
      auVar26 = vsqrtss_avx(auVar26,auVar26);
      auVar24 = vdivss_avx512f(auVar22,auVar26);
      auVar22 = vdivss_avx512f(auVar23,auVar26);
      auVar42 = ZEXT416((uint)(auVar24._0_4_ - auVar20._0_4_));
      auVar24 = vinsertps_avx512f(auVar42,ZEXT416((uint)(this->minDirDifferentialX).
                                                        super_Tuple3<pbrt::Vector3,_float>.x),0x10);
      auVar22 = vsubss_avx512f(auVar22,auVar21);
      fVar27 = fVar27 / auVar26._0_4_ - auVar34._0_4_;
      auVar26 = vmulss_avx512f(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27));
      auVar23 = vmulss_avx512f(auVar22,auVar22);
      auVar25._4_12_ = auVar19._4_12_;
      auVar25._0_4_ = auVar26._0_4_;
      auVar26 = vpermt2ps_avx512vl(auVar19,ZEXT416(4),auVar23);
      auVar24 = vmulps_avx512vl(auVar24,auVar24);
      auVar26 = vaddps_avx512vl(auVar24,auVar26);
      auVar26 = vaddps_avx512vl(auVar26,auVar25);
      auVar26 = vsqrtps_avx512vl(auVar26);
      vmovshdup_avx512vl(auVar26);
      vucomiss_avx512f(auVar26);
      if (auVar17._0_4_ < auVar28._0_4_) {
        auVar28 = vinsertps_avx(auVar42,auVar22,0x10);
        uVar6 = vmovlps_avx(auVar28);
        (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar6;
        (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar6 >> 0x20);
        (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = fVar27;
      }
      auVar28 = vmovshdup_avx(auVar38);
      fVar27 = auVar28._0_4_;
      auVar28 = vfmadd213ss_fma(auVar40,auVar38,ZEXT416((uint)(auVar18._0_4_ * fVar27)));
      auVar17 = vfmadd213ss_fma(auVar41,auVar38,ZEXT416((uint)(fVar39 * fVar27)));
      auVar26 = vfnmadd231ss_fma(auVar28,auVar37,auVar36);
      auVar28 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar37,auVar17);
      auVar17 = vfmadd213ss_fma(auVar35,auVar38,ZEXT416((uint)(fVar46 * fVar27)));
      auVar17 = vfmadd213ss_fma(auVar29,auVar37,auVar17);
      fVar45 = auVar28._0_4_;
      fVar39 = auVar26._0_4_;
      fVar27 = auVar17._0_4_;
      auVar28 = ZEXT416((uint)(fVar27 * fVar27 + fVar45 * fVar45 + fVar39 * fVar39));
      auVar28 = vsqrtss_avx(auVar28,auVar28);
      fVar33 = auVar28._0_4_;
      fVar27 = fVar27 / fVar33 - auVar34._0_4_;
      uVar5 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
      uVar10 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z;
      auVar35 = ZEXT416((uint)(fVar45 / fVar33 - auVar20._0_4_));
      auVar28 = vinsertps_avx(auVar35,ZEXT416((uint)(this->minDirDifferentialY).
                                                    super_Tuple3<pbrt::Vector3,_float>.x),0x10);
      fVar33 = fVar39 / fVar33 - auVar21._0_4_;
      auVar43._0_4_ = (float)uVar5 * (float)uVar5;
      auVar43._4_4_ = (float)uVar10 * (float)uVar10;
      auVar43._8_8_ = 0;
      auVar17 = vpermt2ps_avx512vl(auVar43,SUB6416(ZEXT464(4),0),ZEXT416((uint)(fVar33 * fVar33)));
      auVar29._0_4_ = auVar28._0_4_ * auVar28._0_4_ + auVar17._0_4_ + fVar27 * fVar27;
      auVar29._4_4_ = auVar28._4_4_ * auVar28._4_4_ + auVar17._4_4_ + auVar43._4_4_;
      auVar29._8_4_ = auVar28._8_4_ * auVar28._8_4_ + auVar17._8_4_ + 0.0;
      auVar29._12_4_ = auVar28._12_4_ * auVar28._12_4_ + auVar17._12_4_ + 0.0;
      auVar17 = vsqrtps_avx(auVar29);
      auVar28 = vmovshdup_avx(auVar17);
      local_100._88_4_ = auVar37._0_4_;
      if (auVar17._0_4_ < auVar28._0_4_) {
        auVar28 = vinsertps_avx(auVar35,ZEXT416((uint)fVar33),0x10);
        uVar6 = vmovlps_avx(auVar28);
        (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar6;
        (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar6 >> 0x20);
        (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = fVar27;
      }
    }
    iVar16 = iVar16 + 1;
  } while (iVar16 != 0x200);
  if (LOGGING_LogLevel < 1) {
    aVar1 = (anon_struct_8_0_00000001_for___align)((long)local_100 + 0x10);
    local_100._8_4_ = 0;
    local_100._12_4_ = 0;
    local_100._16_4_ = local_100._16_4_ & 0xffffff00;
    local_100._0_8_ = aVar1;
    detail::stringPrintfRecursive<pbrt::Vector3<float>&,pbrt::Vector3<float>&>
              ((string *)local_100,"Camera min pos differentials: %s, %s",local_78,local_70);
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cameras.cpp"
        ,0xe7,(char *)local_100._0_8_);
    if ((anon_struct_8_0_00000001_for___align)local_100._0_8_ != aVar1) {
      operator_delete((void *)local_100._0_8_,CONCAT44(local_100._20_4_,local_100._16_4_) + 1);
    }
    if (LOGGING_LogLevel < 1) {
      local_100._8_4_ = 0;
      local_100._12_4_ = 0;
      local_100._16_4_ = local_100._16_4_ & 0xffffff00;
      local_100._0_8_ = aVar1;
      detail::stringPrintfRecursive<pbrt::Vector3<float>&,pbrt::Vector3<float>&>
                ((string *)local_100,"Camera min dir differentials: %s, %s",local_88,local_80);
      Log(Verbose,
          "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cameras.cpp"
          ,0xe9,(char *)local_100._0_8_);
      if ((anon_struct_8_0_00000001_for___align)local_100._0_8_ != aVar1) {
        operator_delete((void *)local_100._0_8_,CONCAT44(local_100._20_4_,local_100._16_4_) + 1);
      }
    }
  }
  return;
}

Assistant:

void CameraBase::FindMinimumDifferentials(CameraHandle camera) {
    minPosDifferentialX = minPosDifferentialY = minDirDifferentialX =
        minDirDifferentialY = Vector3f(Infinity, Infinity, Infinity);

    CameraSample sample;
    sample.pLens = Point2f(0.5, 0.5);
    sample.time = 0.5;
    SampledWavelengths lambda = SampledWavelengths::SampleXYZ(0.5);

    int n = 512;
    for (int i = 0; i < n; ++i) {
        sample.pFilm.x = Float(i) / (n - 1) * film.FullResolution().x;
        sample.pFilm.y = Float(i) / (n - 1) * film.FullResolution().y;

        pstd::optional<CameraRayDifferential> crd =
            camera.GenerateRayDifferential(sample, lambda);
        if (!crd)
            continue;

        RayDifferential &ray = crd->ray;
        Vector3f dox = CameraFromRender(ray.rxOrigin - ray.o, ray.time);
        if (Length(dox) < Length(minPosDifferentialX))
            minPosDifferentialX = dox;
        Vector3f doy = CameraFromRender(ray.ryOrigin - ray.o, ray.time);
        if (Length(doy) < Length(minPosDifferentialY))
            minPosDifferentialY = doy;

        ray.d = Normalize(ray.d);
        ray.rxDirection = Normalize(ray.rxDirection);
        ray.ryDirection = Normalize(ray.ryDirection);

        Frame f = Frame::FromZ(ray.d);
        Vector3f df = f.ToLocal(ray.d);  // should be (0, 0, 1);
        Vector3f dxf = Normalize(f.ToLocal(ray.rxDirection));
        Vector3f dyf = Normalize(f.ToLocal(ray.ryDirection));

        if (Length(dxf - df) < Length(minDirDifferentialX))
            minDirDifferentialX = dxf - df;
        if (Length(dyf - df) < Length(minDirDifferentialY))
            minDirDifferentialY = dyf - df;
    }

    LOG_VERBOSE("Camera min pos differentials: %s, %s", minPosDifferentialX,
                minPosDifferentialY);
    LOG_VERBOSE("Camera min dir differentials: %s, %s", minDirDifferentialX,
                minDirDifferentialY);
}